

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void substSelect(SubstContext *pSubst,Select *p,int doPrior)

{
  Expr *pEVar1;
  anon_union_8_3_fafd40d6_for_u1 *paVar2;
  int iVar3;
  
  if (p != (Select *)0x0) {
    do {
      substExprList(pSubst,p->pEList);
      substExprList(pSubst,p->pGroupBy);
      substExprList(pSubst,p->pOrderBy);
      pEVar1 = substExpr(pSubst,p->pHaving);
      p->pHaving = pEVar1;
      pEVar1 = substExpr(pSubst,p->pWhere);
      p->pWhere = pEVar1;
      paVar2 = &p->pSrc->a[0].u1;
      for (iVar3 = p->pSrc->nSrc; 0 < iVar3; iVar3 = iVar3 + -1) {
        substSelect(pSubst,(Select *)paVar2[-6].pFuncArg,1);
        if (((ulong)paVar2->zIndexedBy & 0x40000000000) != 0) {
          substExprList(pSubst,paVar2->pFuncArg);
        }
        paVar2 = paVar2 + 0xd;
      }
    } while ((doPrior != 0) && (p = p->pPrior, p != (Select *)0x0));
  }
  return;
}

Assistant:

static void substSelect(
  SubstContext *pSubst, /* Description of the substitution */
  Select *p,            /* SELECT statement in which to make substitutions */
  int doPrior           /* Do substitutes on p->pPrior too */
){
  SrcList *pSrc;
  SrcItem *pItem;
  int i;
  if( !p ) return;
  do{
    substExprList(pSubst, p->pEList);
    substExprList(pSubst, p->pGroupBy);
    substExprList(pSubst, p->pOrderBy);
    p->pHaving = substExpr(pSubst, p->pHaving);
    p->pWhere = substExpr(pSubst, p->pWhere);
    pSrc = p->pSrc;
    assert( pSrc!=0 );
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      substSelect(pSubst, pItem->pSelect, 1);
      if( pItem->fg.isTabFunc ){
        substExprList(pSubst, pItem->u1.pFuncArg);
      }
    }
  }while( doPrior && (p = p->pPrior)!=0 );
}